

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::NetAliasSymbol::serializeTo(NetAliasSymbol *this,ASTSerializer *serializer)

{
  long lVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  string_view name;
  
  name._M_str = "netReferences";
  name._M_len = 0xd;
  ASTSerializer::startArray(serializer,name);
  sVar2 = getNetReferences(this);
  for (lVar1 = 0; sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1; lVar1 = lVar1 + 8)
  {
    ASTSerializer::serialize(serializer,*(Expression **)((long)sVar2._M_ptr + lVar1));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void NetAliasSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("netReferences");
    for (auto expr : getNetReferences())
        serializer.serialize(*expr);
    serializer.endArray();
}